

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  U32 *pUVar1;
  BYTE *pBVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  rawSeq *prVar7;
  U32 UVar8;
  ldmState_t *plVar9;
  U32 UVar10;
  ulong uVar11;
  XXH64_hash_t XVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  byte bVar16;
  BYTE *pBVar17;
  U32 maxDist;
  uint uVar18;
  long lVar19;
  XXH64_hash_t extraout_RDX;
  ldmEntry_t *plVar20;
  BYTE *pBVar21;
  U32 UVar22;
  ldmEntry_t *plVar23;
  BYTE *pBVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ldmEntry_t **pplVar28;
  BYTE *pBVar29;
  ldmMatchCandidate_t *plVar30;
  BYTE *local_1a8;
  uint local_164;
  ldmState_t *local_160;
  ulong local_158;
  BYTE *local_150;
  size_t local_148;
  rawSeqStore_t *local_140;
  BYTE *local_138;
  BYTE *local_130;
  ldmEntry_t *local_128;
  BYTE *local_120;
  BYTE *local_118;
  BYTE *local_110;
  ulong local_108;
  uint local_fc;
  long local_f8;
  U32 *local_f0;
  ldmMatchCandidate_t *local_e8;
  size_t local_e0;
  size_t local_d8;
  BYTE *local_d0;
  ulong local_c8;
  ulong local_c0;
  BYTE *local_b8;
  ulong local_b0;
  BYTE *local_a8;
  void *local_a0;
  size_t local_98;
  long local_90;
  ulong local_88;
  ldmEntry_t **local_80;
  size_t *local_78;
  long local_70;
  BYTE *local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ldmRollingHashState_t hashState;
  
  maxDist = 1 << ((byte)params->windowLog & 0x1f);
  local_a8 = (BYTE *)((long)src + srcSize);
  local_90 = ((srcSize >> 0x14) + 1) - (ulong)((srcSize & 0xfffff) == 0);
  local_a0 = src;
  local_98 = srcSize;
  if ((ldmState->window).nextSrc < local_a8) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e57,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  uVar26 = sequences->size;
  if (uVar26 < sequences->pos) {
    __assert_fail("sequences->pos <= sequences->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e5b,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->capacity < uVar26) {
    __assert_fail("sequences->size <= sequences->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e5c,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  local_f0 = &ldmState->loadedDictEnd;
  local_78 = ldmState->splitIndices;
  local_e8 = ldmState->matchCandidates;
  local_80 = &ldmState->matchCandidates[0].bucket;
  local_158 = 0;
  local_f8 = 0;
  local_160 = ldmState;
  local_140 = sequences;
  do {
    if ((local_f8 == local_90) || (local_140->capacity <= uVar26)) {
      return 0;
    }
    local_1a8 = (BYTE *)((long)local_a0 + local_f8 * 0x100000);
    pBVar24 = local_1a8 + 0x100000;
    if (local_98 + local_f8 * -0x100000 < 0x100000) {
      pBVar24 = local_a8;
    }
    local_88 = uVar26;
    if ((long)local_98 <= local_f8 * 0x100000) {
      __assert_fail("chunkStart < iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7e66,
                    "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                   );
    }
    local_150 = pBVar24;
    if (0xe0000000 < (uint)((int)pBVar24 - *(int *)&(ldmState->window).base)) {
      UVar8 = params->hashLog;
      UVar10 = ZSTD_window_correctOverflow(&ldmState->window,0,maxDist,local_1a8);
      plVar20 = ldmState->hashTable;
      for (lVar19 = 0; 1L << ((byte)UVar8 & 0x3f) != lVar19; lVar19 = lVar19 + 1) {
        uVar4 = plVar20[lVar19].offset;
        UVar22 = uVar4 - UVar10;
        if (uVar4 < UVar10) {
          UVar22 = 0;
        }
        plVar20[lVar19].offset = UVar22;
      }
      *local_f0 = 0;
    }
    ZSTD_window_enforceMaxDist
              (&ldmState->window,local_150,maxDist,local_f0,(ZSTD_matchState_t **)0x0);
    uVar4 = (ldmState->window).dictLimit;
    uVar5 = (ldmState->window).lowLimit;
    UVar8 = params->hashLog;
    bVar16 = (byte)params->bucketSizeLog;
    local_60 = 1L << (bVar16 & 0x3f);
    uVar26 = (ulong)params->minMatchLength;
    local_130 = (BYTE *)0x0;
    uVar25 = uVar4;
    if (uVar5 < uVar4) {
      local_130 = (ldmState->window).dictBase;
      uVar25 = uVar5;
    }
    uVar11 = (long)local_150 - (long)local_1a8;
    local_b0 = uVar11;
    if (uVar26 <= uVar11) {
      local_110 = (ldmState->window).base;
      local_120 = local_130 + uVar25;
      local_d0 = local_130 + uVar4;
      pBVar24 = local_110 + uVar4;
      local_b8 = local_1a8 + uVar11;
      pBVar2 = local_1a8 + (uVar11 - 8);
      ZSTD_ldm_gear_init(&hashState,params);
      local_70 = -uVar26;
      local_fc = ~(-1 << ((char)UVar8 - bVar16 & 0x1f));
      pBVar21 = local_1a8 + uVar26;
      local_108 = uVar26;
      while (pBVar21 < pBVar2) {
        local_164 = 0;
        local_148 = ZSTD_ldm_gear_feed(&hashState,pBVar21,(long)pBVar2 - (long)pBVar21,local_78,
                                       &local_164);
        lVar19 = local_70;
        local_c8 = (ulong)local_164;
        XVar12 = extraout_RDX;
        pplVar28 = local_80;
        local_138 = pBVar21;
        for (uVar26 = 0; plVar9 = local_160, local_c8 != uVar26; uVar26 = uVar26 + 1) {
          sVar13 = local_160->splitIndices[uVar26];
          XVar12 = XXH_INLINE_XXH64(pBVar21 + sVar13 + lVar19,local_108,XVar12);
          uVar18 = (uint)XVar12 & local_fc;
          ((ldmMatchCandidate_t *)(pplVar28 + -2))->split = pBVar21 + sVar13 + lVar19;
          *(uint *)(pplVar28 + -1) = uVar18;
          *(U32 *)((long)pplVar28 + -4) = (U32)(XVar12 >> 0x20);
          XVar12 = (ulong)uVar18 << ((byte)params->bucketSizeLog & 0x3f);
          *pplVar28 = plVar9->hashTable + XVar12;
          pplVar28 = pplVar28 + 3;
        }
        local_68 = local_138 + local_148;
        ldmState = local_160;
        plVar30 = local_e8;
        for (uVar26 = 0; uVar26 != local_c8; uVar26 = uVar26 + 1) {
          pBVar21 = plVar30[uVar26].split;
          uVar18 = plVar30[uVar26].checksum;
          uVar11 = (long)pBVar21 - (long)local_110;
          uVar27 = (ulong)plVar30[uVar26].hash;
          if (pBVar21 < local_1a8) {
LAB_00166a4d:
            bVar16 = (byte)params->bucketSizeLog;
            pBVar21 = ldmState->bucketOffsets;
            bVar3 = pBVar21[uVar27];
            ldmState->hashTable[(uVar27 << (bVar16 & 0x3f)) + (ulong)bVar3] =
                 (ldmEntry_t)(uVar11 & 0xffffffff | (ulong)uVar18 << 0x20);
            pBVar21[uVar27] = ~(byte)(-1 << (bVar16 & 0x1f)) & bVar3 + 1;
          }
          else {
            plVar20 = plVar30[uVar26].bucket;
            plVar23 = plVar20 + local_60;
            local_128 = (ldmEntry_t *)0x0;
            local_c0 = 0;
            local_e0 = 0;
            local_d8 = 0;
            local_118 = pBVar21;
            local_58 = (long)pBVar21 - (long)local_110;
            local_50 = (ulong)plVar30[uVar26].hash;
            local_48 = uVar26;
            for (; plVar20 < plVar23; plVar20 = plVar20 + 1) {
              if (plVar20->checksum == uVar18) {
                uVar6 = plVar20->offset;
                if (uVar25 < uVar6) {
                  if (uVar5 < uVar4) {
                    pBVar17 = local_b8;
                    pBVar29 = local_110;
                    if (uVar6 < uVar4) {
                      pBVar17 = local_d0;
                      pBVar29 = local_130;
                    }
                    pBVar29 = pBVar29 + uVar6;
                    sVar13 = ZSTD_count_2segments(pBVar21,pBVar29,local_b8,pBVar17,pBVar24);
                    if (local_108 <= sVar13) {
                      pBVar17 = pBVar24;
                      if (uVar6 < uVar4) {
                        pBVar17 = local_120;
                      }
                      sVar14 = ZSTD_ldm_countBackwardsMatch(pBVar21,local_1a8,pBVar29,pBVar17);
                      if ((pBVar17 != local_120) && (pBVar29 + -sVar14 == pBVar17)) {
                        sVar15 = ZSTD_ldm_countBackwardsMatch
                                           (local_118 + -sVar14,local_1a8,local_d0,local_120);
                        sVar14 = sVar14 + sVar15;
                      }
LAB_0016690a:
                      pBVar21 = local_118;
                      if (local_c0 < sVar13 + sVar14) {
                        local_128 = plVar20;
                        local_e0 = sVar14;
                        local_d8 = sVar13;
                        local_c0 = sVar13 + sVar14;
                      }
                    }
                  }
                  else {
                    pBVar29 = local_110 + uVar6;
                    sVar13 = ZSTD_count(pBVar21,pBVar29,local_b8);
                    if (local_108 <= sVar13) {
                      sVar14 = ZSTD_ldm_countBackwardsMatch(pBVar21,local_1a8,pBVar29,pBVar24);
                      goto LAB_0016690a;
                    }
                  }
                }
              }
            }
            uVar11 = local_58;
            uVar26 = local_48;
            uVar27 = local_50;
            ldmState = local_160;
            plVar30 = local_e8;
            if (local_128 == (ldmEntry_t *)0x0) goto LAB_00166a4d;
            sVar13 = local_140->size;
            if (sVar13 == local_140->capacity) {
              return 0xffffffffffffffba;
            }
            prVar7 = local_140->seq;
            UVar8 = local_128->offset;
            prVar7[sVar13].litLength = ((int)pBVar21 - (int)local_e0) - (int)local_1a8;
            prVar7[sVar13].matchLength = (int)local_d8 + (int)local_e0;
            prVar7[sVar13].offset = (int)local_58 - UVar8;
            local_140->size = sVar13 + 1;
            bVar16 = (byte)params->bucketSizeLog;
            pBVar21 = local_160->bucketOffsets;
            bVar3 = pBVar21[local_50];
            local_160->hashTable[(local_50 << (bVar16 & 0x3f)) + (ulong)bVar3] =
                 (ldmEntry_t)(local_58 & 0xffffffff | (ulong)uVar18 << 0x20);
            pBVar21[local_50] = ~(byte)(-1 << (bVar16 & 0x1f)) & bVar3 + 1;
            local_1a8 = local_118 + local_d8;
            if (local_68 < local_1a8) {
              local_138 = local_1a8 + -local_148;
              break;
            }
          }
        }
        pBVar21 = local_138 + local_148;
      }
      uVar11 = (long)local_150 - (long)local_1a8;
      if (0xffffffffffffff88 < uVar11) {
        return uVar11;
      }
    }
    uVar26 = local_140->size;
    if (local_88 < uVar26) {
      pUVar1 = &local_140->seq[local_88].litLength;
      *pUVar1 = *pUVar1 + (int)local_158;
    }
    else {
      if (uVar11 != local_b0) {
        __assert_fail("newLeftoverSize == chunkSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7e8d,
                      "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                     );
      }
      uVar11 = local_b0 + local_158;
    }
    local_f8 = local_f8 + 1;
    local_158 = uVar11;
  } while( true );
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, 0, maxDist, ldmState->loadedDictEnd, chunkStart, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
            /* invalidate dictionaries on overflow correction */
            ldmState->loadedDictEnd = 0;
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         offset against maxDist directly.
         *
         * NOTE: Because of dictionaries + sequence splitting we MUST make sure
         * that any offset used is valid at the END of the sequence, since it may
         * be split into two sequences. This condition holds when using
         * ZSTD_window_enforceMaxDist(), but if we move to checking offsets
         * against maxDist directly, we'll have to carefully handle that case.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}